

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O2

void __thiscall
pstore::error_or<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>::~error_or
          (error_or<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_> *this)

{
  unique_ptr<std::thread,_std::default_delete<std::thread>_> *this_00;
  
  if (this->has_error_ == false) {
    this_00 = error_or<std::unique_ptr<std::thread,std::default_delete<std::thread>>>::
              value_storage_impl<pstore::error_or<std::unique_ptr<std::thread,std::default_delete<std::thread>>>&,std::unique_ptr<std::thread,std::default_delete<std::thread>>>
                        (this);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(this_00);
    return;
  }
  if (this->has_error_ != false) {
    return;
  }
  assert_failed("e.has_error_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/error_or.hpp"
                ,0xd3);
}

Assistant:

error_or<T>::~error_or () {
        if (!has_error_) {
            get_storage ()->~storage_type ();
        } else {
            using error_code = std::error_code;
            get_error_storage ()->~error_code ();
        }
    }